

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

void idx2::ComputeBrickResolution(brick_pool *Bp)

{
  v3<int> *pvVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  idx2_file *this;
  allocator *paVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  u64 uVar11;
  long lVar12;
  int iVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong in_R8;
  uint uVar19;
  uint uVar20;
  int iVar21;
  byte bVar22;
  ulong uVar23;
  v3i Brick3;
  u64 BrickKey;
  iterator BrickIt;
  stack_item Stack [128];
  allocator *paStack_1038;
  uint uStack_1030;
  byte abStack_102c [4];
  uint auStack_1028 [3];
  char acStack_101c [1944];
  uint local_884;
  int local_880;
  undefined1 local_860 [24];
  undefined1 local_848 [8];
  undefined1 local_840 [8];
  allocator *local_838;
  uint local_830;
  byte local_82c [4];
  uint auStack_828 [3];
  char acStack_81c [2028];
  
  this = Bp->Idx2;
  lVar10 = 0xd;
  do {
    *(undefined8 *)(local_848 + lVar10 + 3) = 0;
    *(undefined4 *)(local_840 + lVar10 + 3) = 0;
    *(undefined2 *)(local_840 + lVar10 + 7) = 0xffff;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x80d);
  local_838 = (allocator *)0x0;
  local_830 = 0;
  local_82c[1] = this->NLevels - 1;
  local_82c[0] = local_82c[1];
  bVar15 = 0;
  local_880 = 0;
  local_884 = 0;
  uVar20 = 0;
  do {
    bVar14 = bVar15 - 1;
    uVar8 = (ulong)bVar15;
    paVar7 = (&local_838)[uVar8 * 2];
    uVar18 = (&local_830)[uVar8 * 4];
    bVar2 = local_82c[uVar8 * 0x10];
    uVar23 = (ulong)(char)bVar2;
    bVar22 = local_82c[uVar8 * 0x10 + 1];
    Brick3.field_0._0_8_ = (unsigned_long *)CONCAT44(0,uVar18);
    Brick3.field_0._8_4_ = (undefined4)in_R8;
    in_R8 = in_R8 & 0xffffffff;
    iVar13 = (int)paVar7;
    uVar11 = GetLinearBrick((idx2 *)this,(idx2_file *)(uVar23 & 0xffffffff),iVar13,Brick3);
    local_860._0_8_ = uVar11 * 0x10 + uVar23;
    Lookup<unsigned_long,idx2::brick_volume>
              ((iterator *)(local_860 + 8),(idx2 *)Bp,
               (hash_table<unsigned_long,_idx2::brick_volume> *)local_860,Brick3.field_0._0_8_);
    if (*(char *)(*(long *)((long)local_848 + 0x10) + (long)local_840) == '\x02') {
      bVar22 = bVar2;
    }
    bVar15 = bVar14;
    if ((long)uVar23 < 1) {
      if ('\0' < (char)bVar22) {
        (Bp->ResolutionLevels).Buffer.Data[uVar11] = bVar22;
      }
    }
    else {
      if (0x10 < bVar2) goto LAB_00185e37;
      iVar3 = (this->GroupBrick3).field_0.field_0.X;
      iVar4 = (this->GroupBrick3).field_0.field_0.Y;
      iVar5 = (this->GroupBrick3).field_0.field_0.Z;
      pvVar1 = (this->NBricks3).Arr + (byte)(bVar2 - 1);
      iVar6 = (pvVar1->field_0).field_0.X;
      uVar16 = 0;
      do {
        iVar21 = (uVar16 & 1) + iVar13 * iVar3;
        uVar17 = (int)((ulong)paVar7 >> 0x20) * iVar4 + (uint)((uVar16 >> 1 & 1) != 0);
        in_R8 = (ulong)uVar17;
        uVar19 = (uVar18 * iVar5 + 1) - (uint)(uVar16 < 4);
        if (((iVar21 < iVar6) && ((int)uVar17 < (pvVar1->field_0).field_0.Y)) &&
           ((int)uVar19 < (pvVar1->field_0).field_0.Z)) {
          bVar15 = bVar15 + 1;
          lVar10 = (long)(char)bVar15;
          in_R8 = 0;
          (&local_838)[lVar10 * 2] = (allocator *)CONCAT44(uVar17,iVar21);
          (&local_830)[lVar10 * 4] = uVar19;
          local_82c[lVar10 * 0x10] = bVar2 - 1;
          local_82c[lVar10 * 0x10 + 1] = bVar22;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 8);
    }
    if ((char)bVar15 < '\0') {
      cVar9 = this->NLevels;
      lVar10 = (long)cVar9;
      if (0x10 < lVar10) {
LAB_00185e37:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      uVar20 = uVar20 + 1;
      iVar13 = (this->NBricks3).Arr[lVar10 + -1].field_0.field_0.X;
      if (iVar13 <= (int)uVar20) {
        uVar18 = local_884 + 1;
        uVar20 = 0;
        iVar3 = (this->NBricks3).Arr[lVar10 + -1].field_0.field_0.Y;
        local_884 = uVar18;
        if (iVar3 <= (int)uVar18) {
          local_884 = uVar20;
        }
        in_R8 = (ulong)local_884;
        local_880 = local_880 + (uint)(iVar3 <= (int)uVar18);
      }
      if (iVar13 <= (int)uVar20) {
        return;
      }
      if ((this->NBricks3).Arr[lVar10 + -1].field_0.field_0.Y <= (int)local_884) {
        return;
      }
      if ((this->NBricks3).Arr[lVar10 + -1].field_0.field_0.Z <= local_880) {
        return;
      }
      lVar10 = (long)(char)bVar15;
      bVar15 = bVar15 + 1;
      lVar12 = lVar10 * 0x10;
      auStack_828[lVar10 * 4] = uVar20;
      auStack_828[lVar10 * 4 + 1] = local_884;
      *(int *)(acStack_81c + lVar12 + -4) = local_880;
      cVar9 = cVar9 + -1;
      acStack_81c[lVar12 + 1] = cVar9;
      acStack_81c[lVar12] = cVar9;
    }
    if ((char)bVar15 < '\0') {
      return;
    }
  } while( true );
}

Assistant:

void
ComputeBrickResolution(brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  stack_item Stack[idx2_file::MaxLevels * 8];
  i8 LastIndex = 0;
  /* push all bricks at the coarsest level */
  v3i CurrCoarsestBrick = v3i(0);
  stack_item& First = Stack[LastIndex];
  First.Brick3 = CurrCoarsestBrick;
  First.Level = First.ResolutionToSet = Idx2->NLevels - 1;
  //i64 Count = 0;
  while (LastIndex >= 0)
  {
    // pop the stack
    stack_item Current = Stack[LastIndex--];
    // get the current brick
    u64 BrickIndex = GetLinearBrick(*Idx2, Current.Level, Current.Brick3);
    u64 BrickKey = GetBrickKey(Current.Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);

    if (BrickIt)
    {
      idx2_Assert(BrickIt.Val->Significant);
      Current.ResolutionToSet = Current.Level;
    }
    // push the children if not at the finest level
    if (Current.Level > 0)
    {
      i8 NextLevel = Current.Level - 1;
      for (int I = 0; I < 8; ++I)
      {
        int X = BitSet(I, 0);
        int Y = BitSet(I, 1);
        int Z = BitSet(I, 2);
        v3i ChildBrick3 = Current.Brick3 * Idx2->GroupBrick3 + v3i(X, Y, Z);
        if (ChildBrick3 < Idx2->NBricks3[NextLevel])
        {
          stack_item& Child = Stack[++LastIndex];
          Child.Brick3 = ChildBrick3;
          Child.Level = Current.Level - 1;
          Child.ResolutionToSet = Current.ResolutionToSet;
        }
      }
    }
    else // finest level, set the level if necessary
    {
      // TODO: we should just stuff 4 bits into the brick key instead of using a separate
      // ResolutionStream
      if (Current.ResolutionToSet > 0)
      {// by default, the bit stream is init to 0 so no need to write if ResolutionToSet == 0
        Bp->ResolutionLevels[BrickIndex] = Current.ResolutionToSet;
      }
      //printf("level = %d\n", Current.ResolutionToSet);
      //v3i Brick3 = GetSpatialBrick(*Idx2, Current.Level, BrickIndex);
      //idx2_Assert(Brick3 == Current.Brick3);
      //++Count;
    }

    /* push the next brick at the coarsest resolution if stack is empty */
    if (LastIndex < 0)
    {
      ++CurrCoarsestBrick.X;
      if (CurrCoarsestBrick.X >= Idx2->NBricks3[Idx2->NLevels - 1].X)
      {
        CurrCoarsestBrick.X = 0;
        ++CurrCoarsestBrick.Y;
        if (CurrCoarsestBrick.Y >= Idx2->NBricks3[Idx2->NLevels - 1].Y)
        {
          CurrCoarsestBrick.Y = 0;
          ++CurrCoarsestBrick.Z;
        }
      }
      if (CurrCoarsestBrick < Idx2->NBricks3[Idx2->NLevels - 1])
      {
        stack_item& Next = Stack[++LastIndex];
        Next.Brick3 = CurrCoarsestBrick;
        Next.Level = Next.ResolutionToSet = Idx2->NLevels - 1;
      }
    }
  }

  //printf("num finest bricks = %" PRIi64 "\n", Count);
}